

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putRGBUAcontig8bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  
  if (h != 0) {
    uVar2 = img->samplesperpixel;
    do {
      if (w != 0) {
        puVar3 = img->UaToAa;
        uVar4 = w;
        do {
          bVar1 = pp[3];
          *cp = (uint)bVar1 << 0x18 | (uint)puVar3[(ulong)*pp + (ulong)bVar1 * 0x100] |
                (uint)puVar3[(ulong)pp[1] + (ulong)bVar1 * 0x100] << 8 |
                (uint)puVar3[(ulong)pp[2] + (ulong)bVar1 * 0x100] << 0x10;
          cp = cp + 1;
          pp = pp + uVar2;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      pp = pp + (long)fromskew * (ulong)uVar2;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig8bittile)
{
    int samplesperpixel = img->samplesperpixel;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = pp[3];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[pp[0]];
            g = m[pp[1]];
            b = m[pp[2]];
            *cp++ = PACK4(r, g, b, a);
            pp += samplesperpixel;
        }
        cp += toskew;
        pp += fromskew;
    }
}